

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tournser.cpp
# Opt level: O3

void __thiscall delta_complex_t::print_complex(delta_complex_t *this,string *filename)

{
  long *plVar1;
  pointer pvVar2;
  ulong uVar3;
  long lVar4;
  pointer pdVar5;
  ulong uVar6;
  ulong uVar7;
  ofstream outstream;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream((string *)&local_230);
  std::ofstream::open((string *)&local_230,(_Ios_Openmode)filename);
  if ((this->cells).
      super__Vector_base<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->cells).
      super__Vector_base<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar7 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"Dim ",4);
      plVar1 = (long *)std::ostream::operator<<((ostream *)&local_230,(int)uVar7);
      std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
      std::ostream::put((char)plVar1);
      std::ostream::flush();
      pvVar2 = (this->cells).
               super__Vector_base<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pdVar5 = *(pointer *)
                &pvVar2[uVar7].
                 super__Vector_base<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>.
                 _M_impl;
      if (*(pointer *)
           ((long)&pvVar2[uVar7].
                   super__Vector_base<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>.
                   _M_impl + 8) != pdVar5) {
        lVar4 = 0;
        uVar6 = 0;
        do {
          delta_complex_cell_t::print_cell
                    ((delta_complex_cell_t *)
                     ((long)&(pdVar5->coboundary).super__Vector_base<long,_std::allocator<long>_> +
                     lVar4),(ofstream *)&local_230);
          uVar6 = uVar6 + 1;
          pvVar2 = (this->cells).
                   super__Vector_base<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pdVar5 = *(pointer *)
                    &pvVar2[uVar7].
                     super__Vector_base<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>
                     ._M_impl;
          uVar3 = ((long)*(pointer *)
                          ((long)&pvVar2[uVar7].
                                  super__Vector_base<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>
                                  ._M_impl + 8) - (long)pdVar5 >> 3) * 0x34f72c234f72c235;
          lVar4 = lVar4 + 0xe8;
        } while (uVar6 <= uVar3 && uVar3 - uVar6 != 0);
      }
      uVar7 = uVar7 + 1;
      uVar6 = ((long)(this->cells).
                     super__Vector_base<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2 >> 3) *
              -0x5555555555555555;
    } while (uVar7 <= uVar6 && uVar6 - uVar7 != 0);
  }
  std::ofstream::close();
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _PyCFunction_Type;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void print_complex(std::string filename){
        std::ofstream outstream;
        outstream.open(filename);
		for(int i = 0; i < cells.size(); i++){
			outstream << "Dim " << i << std::endl;
			for(int j = 0; j < cells[i].size(); j++){
				cells[i][j].print_cell(outstream);
			}
		}
        outstream.close();
	}